

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O1

TemporalBinInfo *
embree::avx::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::SubdivRecalculatePrimRef,_2UL>::
TemporalBinInfo::merge2(TemporalBinInfo *a,TemporalBinInfo *b)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  size_t sVar6;
  undefined8 uVar7;
  TemporalBinInfo *r;
  TemporalBinInfo *in_RDI;
  
  sVar6 = a->count1[0];
  in_RDI->count0[0] = a->count0[0];
  in_RDI->count1[0] = sVar6;
  aVar1 = a->bounds0[0].bounds0.lower.field_0;
  in_RDI->bounds0[0].bounds0.lower.field_0 = aVar1;
  aVar2 = a->bounds0[0].bounds0.upper.field_0;
  in_RDI->bounds0[0].bounds0.upper.field_0 = aVar2;
  uVar7 = *(undefined8 *)((long)&a->bounds0[0].bounds1.lower.field_0 + 8);
  *(undefined8 *)&in_RDI->bounds0[0].bounds1.lower.field_0 =
       *(undefined8 *)&a->bounds0[0].bounds1.lower.field_0;
  *(undefined8 *)((long)&in_RDI->bounds0[0].bounds1.lower.field_0 + 8) = uVar7;
  uVar7 = *(undefined8 *)((long)&a->bounds0[0].bounds1.upper.field_0 + 8);
  *(undefined8 *)&in_RDI->bounds0[0].bounds1.upper.field_0 =
       *(undefined8 *)&a->bounds0[0].bounds1.upper.field_0;
  *(undefined8 *)((long)&in_RDI->bounds0[0].bounds1.upper.field_0 + 8) = uVar7;
  aVar3 = a->bounds1[0].bounds0.lower.field_0;
  in_RDI->bounds1[0].bounds0.lower.field_0 = aVar3;
  uVar7 = *(undefined8 *)((long)&a->bounds1[0].bounds0.upper.field_0 + 8);
  *(undefined8 *)&in_RDI->bounds1[0].bounds0.upper.field_0 =
       *(undefined8 *)&a->bounds1[0].bounds0.upper.field_0;
  *(undefined8 *)((long)&in_RDI->bounds1[0].bounds0.upper.field_0 + 8) = uVar7;
  uVar7 = *(undefined8 *)((long)&a->bounds1[0].bounds1.lower.field_0 + 8);
  *(undefined8 *)&in_RDI->bounds1[0].bounds1.lower.field_0 =
       *(undefined8 *)&a->bounds1[0].bounds1.lower.field_0;
  *(undefined8 *)((long)&in_RDI->bounds1[0].bounds1.lower.field_0 + 8) = uVar7;
  uVar7 = *(undefined8 *)((long)&a->bounds1[0].bounds1.upper.field_0 + 8);
  *(undefined8 *)&in_RDI->bounds1[0].bounds1.upper.field_0 =
       *(undefined8 *)&a->bounds1[0].bounds1.upper.field_0;
  *(undefined8 *)((long)&in_RDI->bounds1[0].bounds1.upper.field_0 + 8) = uVar7;
  auVar5._0_8_ = in_RDI->count0[0];
  auVar5._8_8_ = in_RDI->count1[0];
  auVar4._0_8_ = b->count0[0];
  auVar4._8_8_ = b->count1[0];
  auVar5 = vpaddq_avx(auVar5,auVar4);
  in_RDI->count0[0] = auVar5._0_8_;
  in_RDI->count1[0] = auVar5._8_8_;
  aVar1.m128 = (__m128)vminps_avx(aVar1.m128,b->bounds0[0].bounds0.lower.field_0);
  in_RDI->bounds0[0].bounds0.lower.field_0 = aVar1;
  aVar1.m128 = (__m128)vmaxps_avx(aVar2.m128,b->bounds0[0].bounds0.upper.field_0);
  in_RDI->bounds0[0].bounds0.upper.field_0 = aVar1;
  aVar1.m128 = (__m128)vminps_avx(in_RDI->bounds0[0].bounds1.lower.field_0,
                                  b->bounds0[0].bounds1.lower.field_0);
  in_RDI->bounds0[0].bounds1.lower.field_0 = aVar1;
  aVar1.m128 = (__m128)vmaxps_avx(in_RDI->bounds0[0].bounds1.upper.field_0,
                                  b->bounds0[0].bounds1.upper.field_0);
  in_RDI->bounds0[0].bounds1.upper.field_0 = aVar1;
  aVar1.m128 = (__m128)vminps_avx(aVar3.m128,b->bounds1[0].bounds0.lower.field_0);
  in_RDI->bounds1[0].bounds0.lower.field_0 = aVar1;
  aVar1.m128 = (__m128)vmaxps_avx(in_RDI->bounds1[0].bounds0.upper.field_0,
                                  b->bounds1[0].bounds0.upper.field_0);
  in_RDI->bounds1[0].bounds0.upper.field_0 = aVar1;
  aVar1.m128 = (__m128)vminps_avx(in_RDI->bounds1[0].bounds1.lower.field_0,
                                  b->bounds1[0].bounds1.lower.field_0);
  in_RDI->bounds1[0].bounds1.lower.field_0 = aVar1;
  aVar1.m128 = (__m128)vmaxps_avx(in_RDI->bounds1[0].bounds1.upper.field_0,
                                  b->bounds1[0].bounds1.upper.field_0);
  in_RDI->bounds1[0].bounds1.upper.field_0 = aVar1;
  return in_RDI;
}

Assistant:

static __forceinline const TemporalBinInfo merge2(const TemporalBinInfo& a, const TemporalBinInfo& b) {
            TemporalBinInfo r = a; r.merge(b); return r;
          }